

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_float_2_suite::test_same(void)

{
  moment<float,_2> filter;
  size_type local_68;
  value_type_conflict local_5c;
  basic_moment<float,_2UL,_(trial::online::with)1> local_58;
  
  local_58.member.window.super_span<float,_2UL>.member.size = 0;
  local_58.member.window.super_span<float,_2UL>.member.next = 2;
  local_58.member.mean = 0.0;
  local_58.member.window.super_span<float,_2UL>.member.data = (pointer)&local_58;
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,1.0);
  local_68 = local_58.member.window.super_span<float,_2UL>.member.size;
  local_5c = 1.4013e-45;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x14d,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  local_5c = local_58.member.mean;
  local_68 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x14e,"void mean_float_2_suite::test_same()",&local_5c,&local_68);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,1.0);
  local_68 = local_58.member.window.super_span<float,_2UL>.member.size;
  local_5c = 2.8026e-45;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x150,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x151,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  trial::online::window::basic_moment<float,_2UL,_(trial::online::with)1>::push(&local_58,1.0);
  local_5c = (value_type_conflict)((uint)local_5c & 0xffffff00);
  local_68._0_1_ = local_58.member.window.super_span<float,_2UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x153,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT71(local_68._1_7_,local_58.member.window.super_span<float,_2UL>.member.size == 2)
  ;
  local_5c = (value_type_conflict)CONCAT31(local_5c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x154,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  local_68 = local_58.member.window.super_span<float,_2UL>.member.size;
  local_5c = 2.8026e-45;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x155,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x156,"void mean_float_2_suite::test_same()",&local_68,&local_5c);
  return;
}

Assistant:

void test_same()
{
    window::moment<float, 2> filter;
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
}